

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O2

void netaddr_truncate(netaddr *dst,netaddr *src)

{
  byte bVar1;
  ulong __n;
  
  bVar1 = src->_prefix_len;
  __n = (ulong)(uint)(bVar1 >> 3);
  if (src != dst) {
    dst->_prefix_len = bVar1;
    dst->_type = src->_type;
    memcpy(dst,src,__n);
  }
  if ((bVar1 & 7) != 0) {
    dst->_addr[__n] = ""[bVar1 & 7] & src->_addr[__n];
    __n = (ulong)((bVar1 >> 3) + 1);
  }
  if ((uint)__n < 0x10) {
    memset(dst->_addr + __n,0,(ulong)(0x10 - (uint)__n));
    return;
  }
  return;
}

Assistant:

void
netaddr_truncate(struct netaddr *dst, const struct netaddr *src) {
  static uint8_t MASK[] = { 0, 0x80, 0xc0, 0xe0, 0xf0, 0xf8, 0xfc, 0xfe };
  int byte_prefix, bit_prefix;

  /* calulate byte/bit part of prefix */
  byte_prefix = src->_prefix_len / 8;
  bit_prefix = src->_prefix_len & 7;

  if (src != dst) {
    /* copy type and prefix length */
    dst->_prefix_len = src->_prefix_len;
    dst->_type = src->_type;

    /* copy constant octets */
    memcpy(dst->_addr, src->_addr, byte_prefix);
  }

  if (bit_prefix) {
    /* modify bitwise */
    dst->_addr[byte_prefix] = src->_addr[byte_prefix] & MASK[bit_prefix];
    byte_prefix++;
  }

  if (byte_prefix < 16) {
    /* zero rest of address */
    memset(&dst->_addr[byte_prefix], 0, 16 - byte_prefix);
  }
}